

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlIOParseDTD(void)

{
  xmlCharEncoding val;
  xmlSAXHandlerPtr val_00;
  xmlParserInputBufferPtr pxVar1;
  xmlDtdPtr val_01;
  undefined4 local_3c;
  int n_enc;
  xmlCharEncoding enc;
  int n_input;
  xmlParserInputBufferPtr input;
  int n_sax;
  xmlSAXHandlerPtr sax;
  xmlDtdPtr ret_val;
  int test_ret;
  
  for (input._4_4_ = 0; input._4_4_ < 2; input._4_4_ = input._4_4_ + 1) {
    for (n_enc = 0; n_enc < 8; n_enc = n_enc + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        val_00 = gen_xmlSAXHandlerPtr(input._4_4_,0);
        pxVar1 = gen_xmlParserInputBufferPtr(n_enc,1);
        val = gen_xmlCharEncoding(local_3c,2);
        val_01 = (xmlDtdPtr)xmlIOParseDTD(val_00,pxVar1,val);
        desret_xmlDtdPtr(val_01);
        call_tests = call_tests + 1;
        des_xmlSAXHandlerPtr(input._4_4_,val_00,0);
        des_xmlParserInputBufferPtr(n_enc,(xmlParserInputBufferPtr)0x0,1);
        des_xmlCharEncoding(local_3c,val,2);
        xmlResetLastError();
      }
    }
  }
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlIOParseDTD(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED)
#ifdef LIBXML_VALID_ENABLED
    xmlDtdPtr ret_val;
    xmlSAXHandlerPtr sax; /* the SAX handler block or NULL */
    int n_sax;
    xmlParserInputBufferPtr input; /* an Input Buffer */
    int n_input;
    xmlCharEncoding enc; /* the charset encoding if known */
    int n_enc;

    for (n_sax = 0;n_sax < gen_nb_xmlSAXHandlerPtr;n_sax++) {
    for (n_input = 0;n_input < gen_nb_xmlParserInputBufferPtr;n_input++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        sax = gen_xmlSAXHandlerPtr(n_sax, 0);
        input = gen_xmlParserInputBufferPtr(n_input, 1);
        enc = gen_xmlCharEncoding(n_enc, 2);

        ret_val = xmlIOParseDTD(sax, input, enc);
        input = NULL;
        desret_xmlDtdPtr(ret_val);
        call_tests++;
        des_xmlSAXHandlerPtr(n_sax, sax, 0);
        des_xmlParserInputBufferPtr(n_input, input, 1);
        des_xmlCharEncoding(n_enc, enc, 2);
        xmlResetLastError();
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}